

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

size_t __thiscall Messages::Person::ByteSizeLong(Person *this)

{
  bool bVar1;
  int32 value;
  int iVar2;
  string *psVar3;
  size_t sVar4;
  size_t sVar5;
  reference value_00;
  int cached_size;
  Person_PhoneNumber *msg;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<Messages::Person_PhoneNumber> *__range1;
  Person *pPStack_50;
  uint32 cached_has_bits;
  size_t total_size;
  Person *this_local;
  
  if (((this->_has_bits_).has_bits_[0] & 5) == 5) {
    psVar3 = _internal_name_abi_cxx11_(this);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar3);
    value = _internal_id(this);
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(value);
    pPStack_50 = (Person *)(sVar5 + sVar4 + 2);
  }
  else {
    pPStack_50 = (Person *)RequiredFieldsByteSizeFallback(this);
  }
  iVar2 = _internal_phones_size(this);
  pPStack_50 = (Person *)((long)iVar2 + (long)pPStack_50);
  __end1 = google::protobuf::RepeatedPtrField<Messages::Person_PhoneNumber>::begin(&this->phones_);
  msg = (Person_PhoneNumber *)
        google::protobuf::RepeatedPtrField<Messages::Person_PhoneNumber>::end(&this->phones_);
  while( true ) {
    bVar1 = google::protobuf::internal::RepeatedPtrIterator<const_Messages::Person_PhoneNumber>::
            operator!=(&__end1,(iterator *)&msg);
    if (!bVar1) break;
    value_00 = google::protobuf::internal::RepeatedPtrIterator<const_Messages::Person_PhoneNumber>::
               operator*(&__end1);
    sVar4 = google::protobuf::internal::WireFormatLite::MessageSize<Messages::Person_PhoneNumber>
                      (value_00);
    pPStack_50 = (Person *)(&((Person *)(&pPStack_50->_has_bits_ + -4))->super_Message + sVar4);
    google::protobuf::internal::RepeatedPtrIterator<const_Messages::Person_PhoneNumber>::operator++
              (&__end1);
  }
  if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
    psVar3 = _internal_email_abi_cxx11_(this);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar3);
    pPStack_50 = (Person *)((long)(pPStack_50->_has_bits_).has_bits_ + (sVar4 - 0xf));
  }
  if (((uint)*(undefined8 *)&this->field_0x8 & 1) == 1) {
    this_local = (Person *)
                 google::protobuf::internal::ComputeUnknownFieldsSize
                           ((InternalMetadata *)&this->field_0x8,(ulong)pPStack_50,
                            &this->_cached_size_);
  }
  else {
    iVar2 = google::protobuf::internal::ToCachedSize((size_t)pPStack_50);
    SetCachedSize(this,iVar2);
    this_local = pPStack_50;
  }
  return (size_t)this_local;
}

Assistant:

size_t Person::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:Messages.Person)
  size_t total_size = 0;

  if (((_has_bits_[0] & 0x00000005) ^ 0x00000005) == 0) {  // All required fields are present.
    // required string name = 1;
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_name());

    // required int32 id = 2;
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
        this->_internal_id());

  } else {
    total_size += RequiredFieldsByteSizeFallback();
  }
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .Messages.Person.PhoneNumber phones = 4;
  total_size += 1UL * this->_internal_phones_size();
  for (const auto& msg : this->phones_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // optional string email = 3;
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000002u) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_email());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}